

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PerseusStationary.cpp
# Opt level: O2

double __thiscall
PerseusStationary::GetQ
          (PerseusStationary *this,JointBeliefInterface *b,Index jaI,BGPolicyIndex *betaMaxI)

{
  uint uVar1;
  double dVar2;
  
  uVar1 = BeliefValue::GetMaximizingVectorIndex
                    ((BeliefInterface *)(&b->field_0x0 + *(long *)((long)*b + -0xb8)),
                     (ValueFunctionPOMDPDiscrete *)
                     (*(long *)&(this->super_Perseus).field_0xa8 + (ulong)jaI * 0x18));
  *betaMaxI = *(BGPolicyIndex *)
               (*(long *)(*(long *)&(this->super_Perseus).field_0xa8 + (ulong)jaI * 0x18) +
                (ulong)uVar1 * 0x28 + 8);
  dVar2 = (double)(**(code **)(*(long *)(&b->field_0x0 + *(long *)((long)*b + -0xb8)) + 0x80))
                            (&b->field_0x0 + *(long *)((long)*b + -0xb8));
  return dVar2;
}

Assistant:

double PerseusStationary::GetQ(const JointBeliefInterface &b, Index jaI,
                               AlphaVector::BGPolicyIndex &betaMaxI) const
{
    Index maxI=BeliefValue::
        GetMaximizingVectorIndex(b,_m_qFunction[jaI]);
    betaMaxI=_m_qFunction[jaI][maxI].GetBetaI();
    return(b.InnerProduct(_m_qFunction[jaI][maxI].GetValues()));
}